

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void WriteIndentChar(TidyDocImpl *doc)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint c;
  
  uVar1 = (doc->pprint).indent[0].spaces;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  uVar2 = (doc->config).value[0x53].v;
  uVar3 = (uint)uVar2;
  uVar5 = uVar4;
  if ((uVar3 != 0 & 0 < (int)uVar1 & indent_char) == 1) {
    uVar5 = 1;
    if (uVar3 <= uVar4) {
      uVar5 = (uint)((ulong)uVar4 / (uVar2 & 0xffffffff));
    }
  }
  while (uVar5 != 0) {
    c = 0x20;
    if (indent_char != 0) {
      c = 9;
    }
    prvTidyWriteChar(c,doc->docOut);
    uVar5 = uVar5 - 1;
  }
  return;
}

Assistant:

static void WriteIndentChar(TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;
    uint i;
    uint spaces = GetSpaces(pprint);
    uint tabsize = cfg(doc, TidyTabSize);
    if (spaces && (indent_char == '\t') && tabsize)
    {
        spaces /= tabsize;  // set number of tabs to output
        if (spaces == 0)    // with a minimum of one
            spaces = 1;
    }
    for (i = 0; i < spaces; i++)
        TY_(WriteChar)(indent_char, doc->docOut); /* 20150515 - Issue #108 */

}